

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O1

void flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>
               (Schema *schema,uoffset_t newsize,Offset<flatbuffers::String> val,
               Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = newsize - *(uoffset_t *)vec;
  puVar1 = ResizeAnyVector(schema,newsize,(VectorOfAny *)vec,*(uoffset_t *)vec,4,flatbuf,root_table)
  ;
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      *(offset_type *)(puVar1 + uVar2 * 4) = val.o;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void ResizeVector(const reflection::Schema &schema, uoffset_t newsize, T val,
                  const Vector<T> *vec, std::vector<uint8_t> *flatbuf,
                  const reflection::Object *root_table = nullptr) {
  auto delta_elem = static_cast<int>(newsize) - static_cast<int>(vec->size());
  auto newelems = ResizeAnyVector(
      schema, newsize, reinterpret_cast<const VectorOfAny *>(vec), vec->size(),
      static_cast<uoffset_t>(sizeof(T)), flatbuf, root_table);
  // Set new elements to "val".
  for (int i = 0; i < delta_elem; i++) {
    auto loc = newelems + i * sizeof(T);
    auto is_scalar = flatbuffers::is_scalar<T>::value;
    if (is_scalar) {
      WriteScalar(loc, val);
    } else {  // struct
      *reinterpret_cast<T *>(loc) = val;
    }
  }
}